

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void UA_Session_init(UA_Session *session)

{
  UA_Session *session_local;
  
  UA_ApplicationDescription_init(&session->clientDescription);
  session->activated = false;
  UA_NodeId_init(&session->authenticationToken);
  UA_NodeId_init(&session->sessionId);
  UA_String_init(&session->sessionName);
  session->maxRequestMessageSize = 0;
  session->maxResponseMessageSize = 0;
  session->timeout = 0.0;
  UA_DateTime_init(&session->validTill);
  session->channel = (UA_SecureChannel *)0x0;
  session->availableContinuationPoints = 5;
  (session->continuationPoints).lh_first = (ContinuationPointEntry *)0x0;
  (session->serverSubscriptions).lh_first = (UA_Subscription *)0x0;
  session->lastSubscriptionID = 0;
  (session->responseQueue).sqh_first = (UA_PublishResponseEntry *)0x0;
  (session->responseQueue).sqh_last = &(session->responseQueue).sqh_first;
  return;
}

Assistant:

void UA_Session_init(UA_Session *session) {
    UA_ApplicationDescription_init(&session->clientDescription);
    session->activated = false;
    UA_NodeId_init(&session->authenticationToken);
    UA_NodeId_init(&session->sessionId);
    UA_String_init(&session->sessionName);
    session->maxRequestMessageSize  = 0;
    session->maxResponseMessageSize = 0;
    session->timeout = 0;
    UA_DateTime_init(&session->validTill);
    session->channel = NULL;
    session->availableContinuationPoints = UA_MAXCONTINUATIONPOINTS;
    LIST_INIT(&session->continuationPoints);
#ifdef UA_ENABLE_SUBSCRIPTIONS
    LIST_INIT(&session->serverSubscriptions);
    session->lastSubscriptionID = 0;
    SIMPLEQ_INIT(&session->responseQueue);
#endif
}